

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char * fmt::v8::detail::
       parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>_>
                 *handler)

{
  char cVar1;
  dynamic_format_specs<char> *pdVar2;
  int iVar3;
  char *pcVar4;
  char *local_28;
  precision_adapter local_20;
  
  local_28 = begin + 1;
  if (local_28 == end) {
    iVar3 = 0;
  }
  else {
    iVar3 = (int)*local_28;
  }
  if (iVar3 - 0x30U < 10) {
    iVar3 = parse_nonnegative_int<char>(&local_28,end,-1);
    if (iVar3 == -1) {
      throw_format_error("number is too big");
    }
    ((handler->
     super_dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>
     ).super_specs_setter<char>.specs_)->precision = iVar3;
  }
  else {
    if (iVar3 != 0x7b) {
      throw_format_error("missing precision specifier");
    }
    pcVar4 = begin + 2;
    local_28 = pcVar4;
    if (pcVar4 != end) {
      local_20.handler = handler;
      if ((*pcVar4 == ':') || (*pcVar4 == '}')) {
        iVar3 = compile_parse_context<char,_fmt::v8::detail::error_handler>::next_arg_id
                          ((handler->
                           super_dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>
                           ).context_);
        pdVar2 = (handler->
                 super_dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>
                 ).specs_;
        (pdVar2->precision_ref).kind = index;
        (pdVar2->precision_ref).val.index = iVar3;
        local_28 = pcVar4;
      }
      else {
        local_28 = do_parse_arg_id<char,fmt::v8::detail::parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>>&)::precision_adapter&>
                             (pcVar4,end,&local_20);
      }
    }
    if ((local_28 == end) ||
       (pcVar4 = local_28 + 1, cVar1 = *local_28, local_28 = pcVar4, cVar1 != '}')) {
      throw_format_error("invalid format string");
    }
  }
  if ((handler->arg_type_ < custom_type) && ((0x41feU >> (handler->arg_type_ & 0x1f) & 1) != 0)) {
    throw_format_error("precision not allowed for this argument type");
  }
  return local_28;
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}